

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

ScalarFunction * duckdb::MapFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  ScalarFunction *fun;
  BaseScalarFunction *other;
  LogicalType *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  BaseScalarFunction local_150 [176];
  LogicalType local_a0 [24];
  LogicalType local_88 [24];
  undefined1 local_70 [48];
  LogicalType local_40 [24];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 local_9;
  
  local_9 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0xd9b698);
  duckdb::LogicalType::LogicalType(local_40,MAP);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78
            );
  duckdb::LogicalType::LogicalType(local_88,INVALID);
  this = (LogicalType *)0x0;
  other = (BaseScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (in_RDI,&local_28,local_40,local_70,MapBind,0,0,0,local_88,0,0,0);
  duckdb::LogicalType::~LogicalType(local_88);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xd9b74f);
  duckdb::LogicalType::~LogicalType(local_40);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd9b769);
  duckdb::LogicalType::LogicalType(local_a0,ANY);
  LogicalType::operator=(this,(LogicalType *)other);
  duckdb::LogicalType::~LogicalType(local_a0);
  BaseScalarFunction::SetReturnsError(other);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_150);
  in_RDI->field_0xa9 = 1;
  return in_RDI;
}

Assistant:

ScalarFunction MapFun::GetFunction() {
	ScalarFunction fun({}, LogicalTypeId::MAP, MapFunction, MapBind);
	fun.varargs = LogicalType::ANY;
	BaseScalarFunction::SetReturnsError(fun);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}